

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepFrameBuffer.h
# Opt level: O0

void __thiscall Imf_3_4::DeepFrameBuffer::DeepFrameBuffer(DeepFrameBuffer *this)

{
  long in_RDI;
  
  std::
  map<Imf_3_4::Name,_Imf_3_4::DeepSlice,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
  ::map((map<Imf_3_4::Name,_Imf_3_4::DeepSlice,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
         *)0x10a978);
  Imf_3_4::Slice::Slice((Slice *)(in_RDI + 0x30),HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  return;
}

Assistant:

class IMF_EXPORT_TYPE DeepFrameBuffer
{
public:
    //------------
    // Add a slice
    //------------

    IMF_EXPORT
    void insert (const char name[], const DeepSlice& slice);

    IMF_EXPORT
    void insert (const std::string& name, const DeepSlice& slice);

    //----------------------------------------------------------------
    // Access to existing slices:
    //
    // [n]              Returns a reference to the slice with name n.
    //                  If no slice with name n exists, an IEX_NAMESPACE::ArgExc
    //                  is thrown.
    //
    // findSlice(n)     Returns a pointer to the slice with name n,
    //                  or 0 if no slice with name n exists.
    //
    //----------------------------------------------------------------

    IMF_EXPORT
    DeepSlice& operator[] (const char name[]);
    IMF_EXPORT
    const DeepSlice& operator[] (const char name[]) const;

    IMF_EXPORT
    DeepSlice& operator[] (const std::string& name);
    IMF_EXPORT
    const DeepSlice& operator[] (const std::string& name) const;

    IMF_EXPORT
    DeepSlice* findSlice (const char name[]);
    IMF_EXPORT
    const DeepSlice* findSlice (const char name[]) const;

    IMF_EXPORT
    DeepSlice* findSlice (const std::string& name);
    IMF_EXPORT
    const DeepSlice* findSlice (const std::string& name) const;

    //-----------------------------------------
    // Iterator-style access to existing slices
    //-----------------------------------------

    typedef std::map<Name, DeepSlice> SliceMap;

    class Iterator;
    class ConstIterator;

    IMF_EXPORT
    Iterator begin ();
    IMF_EXPORT
    ConstIterator begin () const;

    IMF_EXPORT
    Iterator end ();
    IMF_EXPORT
    ConstIterator end () const;

    IMF_EXPORT
    Iterator find (const char name[]);
    IMF_EXPORT
    ConstIterator find (const char name[]) const;

    IMF_EXPORT
    Iterator find (const std::string& name);
    IMF_EXPORT
    ConstIterator find (const std::string& name) const;

    //----------------------------------------------------
    // Public function for accessing a sample count slice.
    //----------------------------------------------------

    IMF_EXPORT
    void insertSampleCountSlice (const Slice& slice);
    IMF_EXPORT
    const Slice& getSampleCountSlice () const;

private:
    SliceMap _map;
    Slice    _sampleCounts;
}